

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_edison_fab_c.c
# Opt level: O2

mraa_result_t mraa_intel_edison_i2c_freq(mraa_i2c_context dev,mraa_i2c_mode_t mode)

{
  int __fd;
  mraa_result_t mVar1;
  ssize_t sVar2;
  char *__file;
  size_t sStack_30;
  char bu [5];
  
  if (dev->busnum == 1) {
    __file = "/sys/devices/pci0000:00/0000:00:08.0/i2c_dw_sysnode/mode";
  }
  else {
    if (dev->busnum != 6) {
      syslog(5,"i2c bus selected does not support frequency changes");
      return MRAA_ERROR_FEATURE_NOT_SUPPORTED;
    }
    __file = "/sys/devices/pci0000:00/0000:00:09.1/i2c_dw_sysnode/mode";
  }
  __fd = open(__file,2);
  if (__fd == -1) {
    return MRAA_ERROR_INVALID_RESOURCE;
  }
  if (mode == MRAA_I2C_HIGH) {
    builtin_strncpy(bu,"high",4);
  }
  else {
    if (mode != MRAA_I2C_FAST) {
      if (mode != MRAA_I2C_STD) {
        syslog(3,"Invalid i2c mode selected");
        close(__fd);
        return MRAA_ERROR_INVALID_PARAMETER;
      }
      builtin_strncpy(bu,"std",4);
      sStack_30 = 3;
      goto LAB_00116cf7;
    }
    builtin_strncpy(bu,"fast",4);
  }
  bu[4] = '\0';
  sStack_30 = 4;
LAB_00116cf7:
  sVar2 = write(__fd,bu,sStack_30);
  close(__fd);
  mVar1 = MRAA_ERROR_INVALID_RESOURCE;
  if (sVar2 != -1) {
    mVar1 = MRAA_SUCCESS;
  }
  return mVar1;
}

Assistant:

mraa_result_t
mraa_intel_edison_i2c_freq(mraa_i2c_context dev, mraa_i2c_mode_t mode)
{
    int sysnode = -1;

    switch (dev->busnum) {
        case 1:
            sysnode = open("/sys/devices/pci0000:00/0000:00:08.0/i2c_dw_sysnode/mode", O_RDWR);
            break;
        case 6:
            sysnode = open("/sys/devices/pci0000:00/0000:00:09.1/i2c_dw_sysnode/mode", O_RDWR);
            break;
        default:
            syslog(LOG_NOTICE, "i2c bus selected does not support frequency changes");
            return MRAA_ERROR_FEATURE_NOT_SUPPORTED;
    }
    if (sysnode == -1) {
        return MRAA_ERROR_INVALID_RESOURCE;
    }

    char bu[5];
    int length;
    switch (mode) {
        case MRAA_I2C_STD:
            length = snprintf(bu, sizeof(bu), "std");
            break;
        case MRAA_I2C_FAST:
            length = snprintf(bu, sizeof(bu), "fast");
            break;
        case MRAA_I2C_HIGH:
            length = snprintf(bu, sizeof(bu), "high");
            break;
        default:
            syslog(LOG_ERR, "Invalid i2c mode selected");
            close(sysnode);
            return MRAA_ERROR_INVALID_PARAMETER;
    }
    if (write(sysnode, bu, length * sizeof(char)) == -1) {
        close(sysnode);
        return MRAA_ERROR_INVALID_RESOURCE;
    }
    close(sysnode);
    return MRAA_SUCCESS;
}